

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

char * jx9MemObjTypeDump(jx9_value *pVal)

{
  jx9_hashmap *pMap;
  char *zType;
  jx9_value *pVal_local;
  
  pMap = (jx9_hashmap *)0x16a96a;
  if ((pVal->iFlags & 0x20U) == 0) {
    if ((pVal->iFlags & 2U) == 0) {
      if ((pVal->iFlags & 4U) == 0) {
        if ((pVal->iFlags & 1U) == 0) {
          if ((pVal->iFlags & 8U) == 0) {
            if ((pVal->iFlags & 0x40U) == 0) {
              if ((pVal->iFlags & 0x100U) != 0) {
                pMap = (jx9_hashmap *)0x169df2;
              }
            }
            else if ((*(uint *)((pVal->x).iVal + 0x40) & 1) == 0) {
              pMap = (jx9_hashmap *)anon_var_dwarf_4d28;
            }
            else {
              pMap = (jx9_hashmap *)anon_var_dwarf_4d1c;
            }
          }
          else {
            pMap = (jx9_hashmap *)0x169d7b;
          }
        }
        else {
          pMap = (jx9_hashmap *)0x16a084;
        }
      }
      else {
        pMap = (jx9_hashmap *)0x169d83;
      }
    }
    else {
      pMap = (jx9_hashmap *)0x169d9e;
    }
  }
  else {
    pMap = (jx9_hashmap *)0x169dc2;
  }
  return (char *)pMap;
}

Assistant:

JX9_PRIVATE const char * jx9MemObjTypeDump(jx9_value *pVal)
{
	const char *zType = "";
	if( pVal->iFlags & MEMOBJ_NULL ){
		zType = "null";
	}else if( pVal->iFlags & MEMOBJ_INT ){
		zType = "int";
	}else if( pVal->iFlags & MEMOBJ_REAL ){
		zType = "float";
	}else if( pVal->iFlags & MEMOBJ_STRING ){
		zType = "string";
	}else if( pVal->iFlags & MEMOBJ_BOOL ){
		zType = "bool";
	}else if( pVal->iFlags & MEMOBJ_HASHMAP ){
		jx9_hashmap *pMap = (jx9_hashmap *)pVal->x.pOther;
		if( pMap->iFlags & HASHMAP_JSON_OBJECT ){
			zType = "JSON Object";
		}else{
			zType = "JSON Array";
		}
	}else if( pVal->iFlags & MEMOBJ_RES ){
		zType = "resource";
	}
	return zType;
}